

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_deviate(ly_ctx *ctx,lys_deviation *dev,LYS_DEVIATE_TYPE mod)

{
  byte bVar1;
  lys_deviate *plVar2;
  lys_deviate *deviate;
  LYS_DEVIATE_TYPE mod_local;
  lys_deviation *dev_local;
  ly_ctx *ctx_local;
  
  if ((dev->deviate_size == '\0') || (dev->deviate->mod != LY_DEVIATE_NO)) {
    if ((uint)dev->deviate_size % 8 == 0) {
      plVar2 = (lys_deviate *)realloc(dev->deviate,(long)(int)(dev->deviate_size + 8) * 0x48);
      if (plVar2 == (lys_deviate *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_deviate");
        return (void *)0x0;
      }
      memset(plVar2 + (int)(uint)dev->deviate_size,0,0x240);
      dev->deviate = plVar2;
    }
    dev->deviate[dev->deviate_size].mod = mod;
    bVar1 = dev->deviate_size;
    dev->deviate_size = bVar1 + 1;
    ctx_local = (ly_ctx *)(dev->deviate + bVar1);
  }
  else {
    ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"not-supported");
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "\"not-supported\" deviation cannot be combined with any other deviation.");
    ctx_local = (ly_ctx *)0x0;
  }
  return ctx_local;
}

Assistant:

void *
yang_read_deviate(struct ly_ctx *ctx, struct lys_deviation *dev, LYS_DEVIATE_TYPE mod)
{
    struct lys_deviate *deviate;

    if (dev->deviate_size && dev->deviate[0].mod == LY_DEVIATE_NO) {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "not-supported");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"not-supported\" deviation cannot be combined with any other deviation.");
        return NULL;
    }
    if (!(dev->deviate_size % LY_YANG_ARRAY_SIZE)) {
        deviate = realloc(dev->deviate, (LY_YANG_ARRAY_SIZE + dev->deviate_size) * sizeof *deviate);
        LY_CHECK_ERR_RETURN(!deviate, LOGMEM(ctx), NULL);
        memset(deviate + dev->deviate_size, 0, LY_YANG_ARRAY_SIZE * sizeof *deviate);
        dev->deviate = deviate;
    }
    dev->deviate[dev->deviate_size].mod = mod;
    return &dev->deviate[dev->deviate_size++];
}